

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O1

void __thiscall
google::protobuf::DescriptorBuilder::AllocateOptions<google::protobuf::FieldDescriptor>
          (DescriptorBuilder *this,Proto *proto,FieldDescriptor *descriptor,int options_field_tag,
          string_view option_name,FlatAllocator *alloc)

{
  char *pcVar1;
  Span<const_int> options_path_00;
  OptionsType *pOVar2;
  string_view name_scope;
  string_view element_name;
  vector<int,_std::allocator<int>_> options_path;
  int local_6c;
  vector<int,_std::allocator<int>_> local_68;
  size_t local_48;
  char *pcStack_40;
  pointer local_38;
  size_type sStack_30;
  
  local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (int *)0x0;
  local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (int *)0x0;
  local_6c = options_field_tag;
  FieldDescriptor::GetLocationPath(descriptor,&local_68);
  if (local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish ==
      local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
              ((vector<int,std::allocator<int>> *)&local_68,
               (iterator)
               local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish,&local_6c);
  }
  else {
    *local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
     _M_finish = local_6c;
    local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
         = local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_finish + 1;
  }
  pcVar1 = (descriptor->all_names_).payload_;
  element_name._M_len = (ulong)*(ushort *)(pcVar1 + 2);
  name_scope._M_str = pcVar1 + ~element_name._M_len;
  sStack_30 = (long)local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start >> 2;
  local_38 = local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start;
  options_path_00.len_ = sStack_30;
  options_path_00.ptr_ =
       local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_start;
  name_scope._M_len = element_name._M_len;
  element_name._M_str = name_scope._M_str;
  local_48 = option_name._M_len;
  pcStack_40 = option_name._M_str;
  pOVar2 = AllocateOptionsImpl<google::protobuf::FieldDescriptor>
                     (this,name_scope,element_name,proto,options_path_00,option_name,alloc);
  descriptor->options_ = pOVar2;
  descriptor->proto_features_ = (FeatureSet *)_FeatureSet_default_instance_;
  descriptor->merged_features_ = (FeatureSet *)_FeatureSet_default_instance_;
  if (local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void DescriptorBuilder::AllocateOptions(
    const typename DescriptorT::Proto& proto, DescriptorT* descriptor,
    int options_field_tag, absl::string_view option_name,
    internal::FlatAllocator& alloc) {
  std::vector<int> options_path;
  descriptor->GetLocationPath(&options_path);
  options_path.push_back(options_field_tag);
  auto options = AllocateOptionsImpl<DescriptorT>(
      descriptor->full_name(), descriptor->full_name(), proto, options_path,
      option_name, alloc);
  descriptor->options_ = options;
  descriptor->proto_features_ = &FeatureSet::default_instance();
  descriptor->merged_features_ = &FeatureSet::default_instance();
}